

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  RayHitK<8> *pRVar4;
  RayHitK<8> *pRVar5;
  RayHitK<8> *pRVar6;
  RayHitK<8> *pRVar7;
  RayHitK<8> *pRVar8;
  undefined4 uVar9;
  undefined1 auVar10 [32];
  AccelData *pAVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [24];
  undefined1 auVar80 [24];
  undefined1 auVar81 [24];
  undefined1 auVar82 [24];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  uint uVar90;
  undefined4 uVar91;
  ulong uVar92;
  int iVar93;
  ulong uVar94;
  long lVar95;
  long lVar96;
  ulong uVar97;
  ulong uVar98;
  long lVar99;
  ulong *puVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  uint uVar116;
  uint uVar128;
  uint uVar129;
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  uint uVar130;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar160;
  undefined1 in_ZMM10 [64];
  undefined1 auVar159 [64];
  float fVar161;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar163 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar174 [64];
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined4 uStack_2b48;
  undefined1 local_2b40 [16];
  undefined1 local_2ae0 [8];
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  float fStack_2ac4;
  float local_2ac0;
  float fStack_2abc;
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  undefined4 uStack_2a44;
  undefined1 local_2a20 [8];
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  undefined4 uStack_2a04;
  float local_29e0;
  float fStack_29dc;
  float fStack_29d8;
  float fStack_29d4;
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [8];
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  float fStack_2904;
  undefined1 local_2900 [8];
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  float fStack_28e4;
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  float fStack_28c4;
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  undefined4 local_2880;
  undefined4 uStack_287c;
  undefined4 uStack_2878;
  undefined4 uStack_2874;
  undefined4 uStack_2870;
  undefined4 uStack_286c;
  undefined4 uStack_2868;
  undefined4 uStack_2864;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined1 local_2760 [32];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined1 local_26c0 [3] [32];
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  undefined4 uStack_2604;
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  undefined4 uStack_25e4;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  undefined4 uStack_25c4;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined4 local_24e0;
  undefined4 uStack_24dc;
  undefined4 uStack_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  uint local_24c0;
  uint uStack_24bc;
  uint uStack_24b8;
  uint uStack_24b4;
  uint uStack_24b0;
  uint uStack_24ac;
  uint uStack_24a8;
  uint uStack_24a4;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  uint local_2480;
  uint uStack_247c;
  uint uStack_2478;
  uint uStack_2474;
  uint uStack_2470;
  uint uStack_246c;
  uint uStack_2468;
  uint uStack_2464;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  uint local_2400;
  uint uStack_23fc;
  uint uStack_23f8;
  uint uStack_23f4;
  uint uStack_23f0;
  uint uStack_23ec;
  uint uStack_23e8;
  uint uStack_23e4;
  undefined1 local_23e0 [32];
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar115 [64];
  
  uVar89 = mm_lookupmask_pd._8_8_;
  uVar88 = mm_lookupmask_pd._0_8_;
  uVar87 = mm_lookupmask_ps._24_8_;
  uVar86 = mm_lookupmask_ps._16_8_;
  auVar32 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
  auVar33 = vpcmpeqd_avx2(auVar32,(undefined1  [32])valid_i->field_0);
  uVar90 = vmovmskps_avx(auVar33);
  if (uVar90 != 0) {
    pAVar11 = This->ptr;
    uVar97 = (ulong)(uVar90 & 0xff);
    auVar83 = *(undefined1 (*) [32])ray;
    local_2600 = *(float *)(ray + 0x20);
    auVar84 = *(undefined1 (*) [32])(ray + 0x20);
    local_2620 = *(float *)(ray + 0x40);
    auVar85 = *(undefined1 (*) [32])(ray + 0x40);
    auVar10 = *(undefined1 (*) [32])(ray + 0x80);
    local_2800._8_4_ = 0x7fffffff;
    local_2800._0_8_ = 0x7fffffff7fffffff;
    local_2800._12_4_ = 0x7fffffff;
    local_2800._16_4_ = 0x7fffffff;
    local_2800._20_4_ = 0x7fffffff;
    local_2800._24_4_ = 0x7fffffff;
    local_2800._28_4_ = 0x7fffffff;
    auVar121._8_4_ = 0x219392ef;
    auVar121._0_8_ = 0x219392ef219392ef;
    auVar121._12_4_ = 0x219392ef;
    auVar121._16_4_ = 0x219392ef;
    auVar121._20_4_ = 0x219392ef;
    auVar121._24_4_ = 0x219392ef;
    auVar121._28_4_ = 0x219392ef;
    auVar107 = vandps_avx(auVar10,local_2800);
    auVar107 = vcmpps_avx(auVar107,auVar121,1);
    auVar140 = vblendvps_avx(auVar10,auVar121,auVar107);
    auVar107 = *(undefined1 (*) [32])(ray + 0xa0);
    auVar152 = vandps_avx(auVar107,local_2800);
    auVar152 = vcmpps_avx(auVar152,auVar121,1);
    auVar141 = vblendvps_avx(auVar107,auVar121,auVar152);
    auVar152 = *(undefined1 (*) [32])(ray + 0xc0);
    auVar136 = vandps_avx(auVar152,local_2800);
    auVar136 = vcmpps_avx(auVar136,auVar121,1);
    auVar146 = vrcpps_avx(auVar140);
    auVar136 = vblendvps_avx(auVar152,auVar121,auVar136);
    auVar151._8_4_ = 0x3f800000;
    auVar151._0_8_ = 0x3f8000003f800000;
    auVar151._12_4_ = 0x3f800000;
    auVar151._16_4_ = 0x3f800000;
    auVar151._20_4_ = 0x3f800000;
    auVar151._24_4_ = 0x3f800000;
    auVar151._28_4_ = 0x3f800000;
    auVar38 = vfnmadd213ps_fma(auVar140,auVar146,auVar151);
    auVar140 = vrcpps_avx(auVar141);
    auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar146,auVar146);
    auVar146 = vrcpps_avx(auVar136);
    auVar39 = vfnmadd213ps_fma(auVar141,auVar140,auVar151);
    auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar140,auVar140);
    auVar40 = vfnmadd213ps_fma(auVar136,auVar146,auVar151);
    auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar146,auVar146);
    local_27e0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
    pRVar6 = ray + 0x100;
    local_2640 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
    auVar146 = ZEXT832(0) << 0x20;
    auVar10 = vcmpps_avx(auVar10,auVar146,1);
    auVar140._8_4_ = 1;
    auVar140._0_8_ = 0x100000001;
    auVar140._12_4_ = 1;
    auVar140._16_4_ = 1;
    auVar140._20_4_ = 1;
    auVar140._24_4_ = 1;
    auVar140._28_4_ = 1;
    auVar10 = vandps_avx(auVar10,auVar140);
    auVar107 = vcmpps_avx(auVar107,auVar146,1);
    auVar141._8_4_ = 2;
    auVar141._0_8_ = 0x200000002;
    auVar141._12_4_ = 2;
    auVar141._16_4_ = 2;
    auVar141._20_4_ = 2;
    auVar141._24_4_ = 2;
    auVar141._28_4_ = 2;
    auVar107 = vandps_avx(auVar107,auVar141);
    auVar107 = vorps_avx(auVar107,auVar10);
    auVar136._8_4_ = 4;
    auVar136._0_8_ = 0x400000004;
    auVar136._12_4_ = 4;
    auVar136._16_4_ = 4;
    auVar136._20_4_ = 4;
    auVar136._24_4_ = 4;
    auVar136._28_4_ = 4;
    auVar10 = vcmpps_avx(auVar152,auVar146,1);
    auVar10 = vandps_avx(auVar10,auVar136);
    auVar32 = vpor_avx2(auVar32 ^ auVar33,auVar10);
    local_26c0[0] = vpor_avx2(auVar32,auVar107);
    local_25e0 = *(float *)ray;
    fStack_25dc = *(float *)(ray + 4);
    fStack_25d8 = *(float *)(ray + 8);
    fStack_25d4 = *(float *)(ray + 0xc);
    fStack_25d0 = *(float *)(ray + 0x10);
    fStack_25cc = *(float *)(ray + 0x14);
    fStack_25c8 = *(float *)(ray + 0x18);
    uStack_25c4 = *(undefined4 *)(ray + 0x1c);
    auVar32._4_4_ = auVar38._4_4_ * -*(float *)(ray + 4);
    auVar32._0_4_ = auVar38._0_4_ * -*(float *)ray;
    auVar32._8_4_ = auVar38._8_4_ * -*(float *)(ray + 8);
    auVar32._12_4_ = auVar38._12_4_ * -*(float *)(ray + 0xc);
    auVar32._16_4_ = -*(float *)(ray + 0x10) * 0.0;
    auVar32._20_4_ = -*(float *)(ray + 0x14) * 0.0;
    auVar32._24_4_ = -*(float *)(ray + 0x18) * 0.0;
    auVar32._28_4_ = 0x3f800000;
    fStack_25fc = *(float *)(ray + 0x24);
    fStack_25f8 = *(float *)(ray + 0x28);
    fStack_25f4 = *(float *)(ray + 0x2c);
    fStack_25f0 = *(float *)(ray + 0x30);
    fStack_25ec = *(float *)(ray + 0x34);
    fStack_25e8 = *(float *)(ray + 0x38);
    uStack_25e4 = *(undefined4 *)(ray + 0x3c);
    auVar174._0_4_ = auVar39._0_4_ * -local_2600;
    auVar174._4_4_ = auVar39._4_4_ * -*(float *)(ray + 0x24);
    auVar174._8_4_ = auVar39._8_4_ * -*(float *)(ray + 0x28);
    auVar174._12_4_ = auVar39._12_4_ * -*(float *)(ray + 0x2c);
    auVar174._16_4_ = -*(float *)(ray + 0x30) * 0.0;
    auVar174._20_4_ = -*(float *)(ray + 0x34) * 0.0;
    auVar174._28_36_ = in_ZMM14._28_36_;
    auVar174._24_4_ = -*(float *)(ray + 0x38) * 0.0;
    fStack_261c = *(float *)(ray + 0x44);
    fStack_2618 = *(float *)(ray + 0x48);
    fStack_2614 = *(float *)(ray + 0x4c);
    fStack_2610 = *(float *)(ray + 0x50);
    fStack_260c = *(float *)(ray + 0x54);
    fStack_2608 = *(float *)(ray + 0x58);
    uStack_2604 = *(undefined4 *)(ray + 0x5c);
    auVar33._4_4_ = auVar40._4_4_ * -*(float *)(ray + 0x44);
    auVar33._0_4_ = auVar40._0_4_ * -local_2620;
    auVar33._8_4_ = auVar40._8_4_ * -*(float *)(ray + 0x48);
    auVar33._12_4_ = auVar40._12_4_ * -*(float *)(ray + 0x4c);
    auVar33._16_4_ = -*(float *)(ray + 0x50) * 0.0;
    auVar33._20_4_ = -*(float *)(ray + 0x54) * 0.0;
    auVar33._24_4_ = -*(float *)(ray + 0x58) * 0.0;
    auVar33._28_4_ = *(undefined4 *)(ray + 0x5c);
    local_26c0[2]._0_8_ = mm_lookupmask_ps._16_8_;
    local_26c0[2]._8_8_ = mm_lookupmask_ps._24_8_;
    local_26c0[2]._16_8_ = mm_lookupmask_ps._16_8_;
    local_26c0[2]._24_8_ = mm_lookupmask_ps._24_8_;
    local_26c0[1]._0_8_ = mm_lookupmask_pd._0_8_;
    local_26c0[1]._8_8_ = mm_lookupmask_pd._8_8_;
    local_26c0[1]._16_8_ = mm_lookupmask_pd._0_8_;
    local_26c0[1]._24_8_ = mm_lookupmask_pd._8_8_;
    local_2660 = 0x7f800000;
    uStack_265c = 0x7f800000;
    uStack_2658 = 0x7f800000;
    uStack_2654 = 0x7f800000;
    uStack_2650 = 0x7f800000;
    uStack_264c = 0x7f800000;
    uStack_2648 = 0x7f800000;
    uStack_2644 = 0x7f800000;
    local_2880 = 0x80000000;
    uStack_287c = 0x80000000;
    uStack_2878 = 0x80000000;
    uStack_2874 = 0x80000000;
    uStack_2870 = 0x80000000;
    uStack_286c = 0x80000000;
    uStack_2868 = 0x80000000;
    uStack_2864 = 0x80000000;
    do {
      lVar99 = 0;
      for (uVar101 = uVar97; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
        lVar99 = lVar99 + 1;
      }
      uVar91 = *(undefined4 *)(local_26c0[0] + lVar99 * 4);
      auVar107._4_4_ = uVar91;
      auVar107._0_4_ = uVar91;
      auVar107._8_4_ = uVar91;
      auVar107._12_4_ = uVar91;
      auVar107._16_4_ = uVar91;
      auVar107._20_4_ = uVar91;
      auVar107._24_4_ = uVar91;
      auVar107._28_4_ = uVar91;
      auVar136 = vpcmpeqd_avx2(auVar107,local_26c0[0]);
      uVar91 = vmovmskps_avx(auVar136);
      uVar97 = ~CONCAT44((int)((ulong)lVar99 >> 0x20),uVar91) & uVar97;
      auVar152._8_4_ = 0x7f800000;
      auVar152._0_8_ = 0x7f8000007f800000;
      auVar152._12_4_ = 0x7f800000;
      auVar152._16_4_ = 0x7f800000;
      auVar152._20_4_ = 0x7f800000;
      auVar152._24_4_ = 0x7f800000;
      auVar152._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar152,auVar83,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar14 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar10 = vblendvps_avx(auVar152,auVar84,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar15 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar10 = vblendvps_avx(auVar152,auVar85,auVar136);
      auVar15 = vunpcklps_avx(auVar14,auVar15);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar14 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar106 = vinsertps_avx(auVar15,auVar14,0x28);
      auVar169._8_4_ = 0xff800000;
      auVar169._0_8_ = 0xff800000ff800000;
      auVar169._12_4_ = 0xff800000;
      auVar169._16_4_ = 0xff800000;
      auVar169._20_4_ = 0xff800000;
      auVar169._24_4_ = 0xff800000;
      auVar169._28_4_ = 0xff800000;
      auVar10 = vblendvps_avx(auVar169,auVar83,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar14 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar10 = vblendvps_avx(auVar169,auVar84,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar15 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar15 = vunpcklps_avx(auVar14,auVar15);
      auVar10 = vblendvps_avx(auVar169,auVar85,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar14 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar13 = vinsertps_avx(auVar15,auVar14,0x28);
      auVar140 = ZEXT1632(auVar38);
      auVar10 = vblendvps_avx(auVar152,auVar140,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar14 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar141 = ZEXT1632(auVar39);
      auVar10 = vblendvps_avx(auVar152,auVar141,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar15 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar146 = ZEXT1632(auVar40);
      auVar10 = vblendvps_avx(auVar152,auVar146,auVar136);
      auVar15 = vunpcklps_avx(auVar14,auVar15);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar14 = vminps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar117 = vinsertps_avx(auVar15,auVar14,0x28);
      auVar10 = vblendvps_avx(auVar169,auVar140,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar14 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar10 = vblendvps_avx(auVar169,auVar141,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar15 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar15 = vunpcklps_avx(auVar14,auVar15);
      auVar10 = vblendvps_avx(auVar169,auVar146,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vmaxps_avx(auVar10,auVar107);
      auVar14 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
      auVar147 = vinsertps_avx(auVar15,auVar14,0x28);
      auVar10 = vblendvps_avx(auVar152,local_27e0,auVar136);
      auVar107 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vminps_avx(auVar10,auVar107);
      auVar107 = vshufpd_avx(auVar10,auVar10,5);
      auVar107 = vminps_avx(auVar10,auVar107);
      auVar10 = vblendvps_avx(auVar169,local_2640,auVar136);
      auVar159 = ZEXT3264(auVar10);
      auVar152 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar10 = vmaxps_avx(auVar10,auVar152);
      auVar152 = vshufpd_avx(auVar10,auVar10,5);
      auVar10 = vmaxps_avx(auVar10,auVar152);
      auVar12 = vcmpps_avx(auVar117,_DAT_01f7aa10,5);
      auVar14 = vblendvps_avx(auVar147,auVar117,auVar12);
      auVar15 = vblendvps_avx(auVar106,auVar13,auVar12);
      local_2820 = auVar15._0_4_;
      fStack_281c = auVar15._4_4_;
      fStack_2818 = auVar15._8_4_;
      fStack_2814 = auVar15._12_4_;
      auVar15 = vblendvps_avx(auVar13,auVar106,auVar12);
      fStack_2810 = auVar14._0_4_;
      auVar13 = vmovshdup_avx(auVar14);
      uVar104 = (ulong)(auVar13._0_4_ < 0.0) << 5 | 0x40;
      auVar106 = vshufpd_avx(auVar14,auVar14,1);
      local_2b40 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
      uVar101 = (ulong)(auVar106._0_4_ < 0.0) << 5 | 0x80;
      auVar106 = vminps_avx(auVar107._0_16_,auVar107._16_16_);
      auVar12 = vblendvps_avx(auVar117,auVar147,auVar12);
      auVar117._0_4_ = fStack_2810 * local_2820;
      auVar117._4_4_ = auVar14._4_4_ * fStack_281c;
      auVar117._8_4_ = auVar14._8_4_ * fStack_2818;
      auVar117._12_4_ = auVar14._12_4_ * fStack_2814;
      local_29e0 = auVar15._0_4_;
      fStack_29dc = auVar15._4_4_;
      fStack_29d8 = auVar15._8_4_;
      fStack_29d4 = auVar15._12_4_;
      local_2420 = auVar12._0_4_;
      auVar147._0_4_ = local_2420 * local_29e0;
      auVar147._4_4_ = auVar12._4_4_ * fStack_29dc;
      auVar147._8_4_ = auVar12._8_4_ * fStack_29d8;
      auVar147._12_4_ = auVar12._12_4_ * fStack_29d4;
      uVar105 = (ulong)(fStack_2810 < 0.0) * 0x20;
      local_23a0 = *(ulong *)&pAVar11[1].bounds.bounds0.lower.field_0;
      local_2398[0] = 0;
      local_2820 = fStack_2810;
      fStack_281c = fStack_2810;
      fStack_2818 = fStack_2810;
      fStack_2814 = fStack_2810;
      fStack_280c = fStack_2810;
      fStack_2808 = fStack_2810;
      fStack_2804 = fStack_2810;
      local_2840 = -auVar117._0_4_;
      fStack_283c = -auVar117._0_4_;
      fStack_2838 = -auVar117._0_4_;
      fStack_2834 = -auVar117._0_4_;
      fStack_2830 = -auVar117._0_4_;
      fStack_282c = -auVar117._0_4_;
      fStack_2828 = -auVar117._0_4_;
      fStack_2824 = -auVar117._0_4_;
      local_2860 = auVar13._0_8_;
      uStack_2858 = local_2860;
      uStack_2850 = local_2860;
      uStack_2848 = local_2860;
      auVar15 = vmovshdup_avx(auVar117);
      uVar90 = auVar15._0_4_;
      uVar27 = auVar15._4_4_;
      local_23c0 = uVar90 ^ 0x80000000;
      uStack_23bc = uVar27 ^ 0x80000000;
      uStack_23b8 = uVar90 ^ 0x80000000;
      uStack_23b4 = uVar27 ^ 0x80000000;
      uStack_23b0 = uVar90 ^ 0x80000000;
      uStack_23ac = uVar27 ^ 0x80000000;
      uStack_23a8 = uVar90 ^ 0x80000000;
      uStack_23a4 = uVar27 ^ 0x80000000;
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      local_23e0._0_8_ = auVar14._0_8_;
      local_23e0._8_8_ = local_23e0._0_8_;
      local_23e0._16_8_ = local_23e0._0_8_;
      local_23e0._24_8_ = local_23e0._0_8_;
      auVar15 = vshufps_avx(auVar117,auVar117,0xaa);
      uVar90 = auVar15._0_4_;
      uVar28 = auVar15._4_4_;
      local_2400 = uVar90 ^ 0x80000000;
      uStack_23fc = uVar28 ^ 0x80000000;
      uStack_23f8 = uVar90 ^ 0x80000000;
      uStack_23f4 = uVar28 ^ 0x80000000;
      uStack_23f0 = uVar90 ^ 0x80000000;
      uStack_23ec = uVar28 ^ 0x80000000;
      uStack_23e8 = uVar90 ^ 0x80000000;
      uStack_23e4 = uVar28 ^ 0x80000000;
      fStack_241c = local_2420;
      fStack_2418 = local_2420;
      fStack_2414 = local_2420;
      fStack_2410 = local_2420;
      fStack_240c = local_2420;
      fStack_2408 = local_2420;
      fStack_2404 = local_2420;
      local_2440 = -auVar147._0_4_;
      fStack_243c = -auVar147._0_4_;
      fStack_2438 = -auVar147._0_4_;
      fStack_2434 = -auVar147._0_4_;
      fStack_2430 = -auVar147._0_4_;
      fStack_242c = -auVar147._0_4_;
      fStack_2428 = -auVar147._0_4_;
      fStack_2424 = -auVar147._0_4_;
      auVar14 = vmovshdup_avx(auVar12);
      local_2460 = auVar14._0_8_;
      uStack_2458 = local_2460;
      uStack_2450 = local_2460;
      uStack_2448 = local_2460;
      auVar14 = vmovshdup_avx(auVar147);
      uVar27 = auVar14._0_4_;
      uVar29 = auVar14._4_4_;
      local_2480 = uVar27 ^ 0x80000000;
      uStack_247c = uVar29 ^ 0x80000000;
      uStack_2478 = uVar27 ^ 0x80000000;
      uStack_2474 = uVar29 ^ 0x80000000;
      uStack_2470 = uVar27 ^ 0x80000000;
      uStack_246c = uVar29 ^ 0x80000000;
      uStack_2468 = uVar27 ^ 0x80000000;
      uStack_2464 = uVar29 ^ 0x80000000;
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      local_24a0 = auVar12._0_8_;
      uStack_2498 = local_24a0;
      uStack_2490 = local_24a0;
      uStack_2488 = local_24a0;
      auVar12 = vshufps_avx(auVar147,auVar147,0xaa);
      uVar26 = auVar12._0_4_;
      uVar30 = auVar12._4_4_;
      local_24c0 = uVar26 ^ 0x80000000;
      uStack_24bc = uVar30 ^ 0x80000000;
      uStack_24b8 = uVar26 ^ 0x80000000;
      uStack_24b4 = uVar30 ^ 0x80000000;
      uStack_24b0 = uVar26 ^ 0x80000000;
      uStack_24ac = uVar30 ^ 0x80000000;
      uStack_24a8 = uVar26 ^ 0x80000000;
      uStack_24a4 = uVar30 ^ 0x80000000;
      local_24e0 = auVar106._0_4_;
      uStack_24dc = local_24e0;
      uStack_24d8 = local_24e0;
      uStack_24d4 = local_24e0;
      uStack_24d0 = local_24e0;
      uStack_24cc = local_24e0;
      uStack_24c8 = local_24e0;
      uStack_24c4 = local_24e0;
      auVar10._8_4_ = 0x7f800000;
      auVar10._0_8_ = 0x7f8000007f800000;
      auVar10._12_4_ = 0x7f800000;
      auVar10._16_4_ = 0x7f800000;
      auVar10._20_4_ = 0x7f800000;
      auVar10._24_4_ = 0x7f800000;
      auVar10._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar10,local_27e0,auVar136);
      puVar100 = local_2390;
      local_2ae0._4_4_ = local_2b40._0_4_;
      local_2ae0._0_4_ = local_2b40._0_4_;
      fStack_2ad8 = (float)local_2b40._0_4_;
      fStack_2ad4 = (float)local_2b40._0_4_;
      fStack_2ad0 = (float)local_2b40._0_4_;
      fStack_2acc = (float)local_2b40._0_4_;
      fStack_2ac8 = (float)local_2b40._0_4_;
      fStack_2ac4 = (float)local_2b40._0_4_;
      do {
        uVar91 = (undefined4)puVar100[-1];
        auVar108._4_4_ = uVar91;
        auVar108._0_4_ = uVar91;
        auVar108._8_4_ = uVar91;
        auVar108._12_4_ = uVar91;
        auVar108._16_4_ = uVar91;
        auVar108._20_4_ = uVar91;
        auVar108._24_4_ = uVar91;
        auVar108._28_4_ = uVar91;
        auVar115 = ZEXT3264(auVar108);
        puVar100 = puVar100 + -2;
        auVar107 = vcmpps_avx(auVar108,auVar159._0_32_,1);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0x7f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0xbf,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar107[0x1f] < '\0') {
          uVar102 = *puVar100;
          while ((uVar102 & 8) == 0) {
            uVar92 = CONCAT44(auVar117._0_4_,auVar117._0_4_);
            auVar25._8_4_ = -auVar117._0_4_;
            auVar25._0_8_ = uVar92 ^ 0x8000000080000000;
            auVar25._12_4_ = -auVar117._0_4_;
            auVar25._16_4_ = -auVar117._0_4_;
            auVar25._20_4_ = -auVar117._0_4_;
            auVar25._24_4_ = -auVar117._0_4_;
            auVar25._28_4_ = -auVar117._0_4_;
            auVar156._4_4_ = fStack_2810;
            auVar156._0_4_ = fStack_2810;
            auVar156._8_4_ = fStack_2810;
            auVar156._12_4_ = fStack_2810;
            auVar156._16_4_ = fStack_2810;
            auVar156._20_4_ = fStack_2810;
            auVar156._24_4_ = fStack_2810;
            auVar156._28_4_ = fStack_2810;
            auVar106 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar102 + 0x40 + uVar105),auVar25,
                                       auVar156);
            auVar78._4_4_ = uStack_23bc;
            auVar78._0_4_ = local_23c0;
            auVar78._8_4_ = uStack_23b8;
            auVar78._12_4_ = uStack_23b4;
            auVar78._16_4_ = uStack_23b0;
            auVar78._20_4_ = uStack_23ac;
            auVar78._24_4_ = uStack_23a8;
            auVar78._28_4_ = uStack_23a4;
            auVar21._8_8_ = local_2860;
            auVar21._0_8_ = local_2860;
            auVar21._16_8_ = local_2860;
            auVar21._24_8_ = local_2860;
            auVar13 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar102 + 0x40 + uVar104),auVar78,
                                      auVar21);
            auVar107 = vpmaxsd_avx2(ZEXT1632(auVar106),ZEXT1632(auVar13));
            auVar77._8_4_ = uVar90 ^ 0x80000000;
            auVar77._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
            auVar77._12_4_ = uVar28 ^ 0x80000000;
            auVar77._16_4_ = uVar90 ^ 0x80000000;
            auVar77._20_4_ = uVar28 ^ 0x80000000;
            auVar77._24_4_ = uVar90 ^ 0x80000000;
            auVar77._28_4_ = uVar28 ^ 0x80000000;
            auVar106 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar102 + 0x40 + uVar101),auVar77,
                                       local_23e0);
            auVar158._4_4_ = local_24e0;
            auVar158._0_4_ = local_24e0;
            auVar158._8_4_ = local_24e0;
            auVar158._12_4_ = local_24e0;
            auVar158._16_4_ = local_24e0;
            auVar158._20_4_ = local_24e0;
            auVar158._24_4_ = local_24e0;
            auVar158._28_4_ = local_24e0;
            auVar152 = vpmaxsd_avx2(ZEXT1632(auVar106),auVar158);
            local_2960 = vpmaxsd_avx2(auVar107,auVar152);
            uVar92 = CONCAT44(auVar147._0_4_,auVar147._0_4_);
            auVar75._8_4_ = -auVar147._0_4_;
            auVar75._0_8_ = uVar92 ^ 0x8000000080000000;
            auVar75._12_4_ = -auVar147._0_4_;
            auVar75._16_4_ = -auVar147._0_4_;
            auVar75._20_4_ = -auVar147._0_4_;
            auVar75._24_4_ = -auVar147._0_4_;
            auVar75._28_4_ = -auVar147._0_4_;
            auVar76._4_4_ = local_2420;
            auVar76._0_4_ = local_2420;
            auVar76._8_4_ = local_2420;
            auVar76._12_4_ = local_2420;
            auVar76._16_4_ = local_2420;
            auVar76._20_4_ = local_2420;
            auVar76._24_4_ = local_2420;
            auVar76._28_4_ = local_2420;
            auVar106 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar102 + 0x40 + (uVar105 ^ 0x20)),
                                       auVar75,auVar76);
            auVar73._8_4_ = uVar27 ^ 0x80000000;
            auVar73._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
            auVar73._12_4_ = uVar29 ^ 0x80000000;
            auVar73._16_4_ = uVar27 ^ 0x80000000;
            auVar73._20_4_ = uVar29 ^ 0x80000000;
            auVar73._24_4_ = uVar27 ^ 0x80000000;
            auVar73._28_4_ = uVar29 ^ 0x80000000;
            auVar74._8_8_ = local_2460;
            auVar74._0_8_ = local_2460;
            auVar74._16_8_ = local_2460;
            auVar74._24_8_ = local_2460;
            auVar13 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar102 + 0x40 + (uVar104 ^ 0x20)),
                                      auVar73,auVar74);
            auVar107 = vpminsd_avx2(ZEXT1632(auVar106),ZEXT1632(auVar13));
            auVar71._8_4_ = uVar26 ^ 0x80000000;
            auVar71._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
            auVar71._12_4_ = uVar30 ^ 0x80000000;
            auVar71._16_4_ = uVar26 ^ 0x80000000;
            auVar71._20_4_ = uVar30 ^ 0x80000000;
            auVar71._24_4_ = uVar26 ^ 0x80000000;
            auVar71._28_4_ = uVar30 ^ 0x80000000;
            auVar72._8_8_ = local_24a0;
            auVar72._0_8_ = local_24a0;
            auVar72._16_8_ = local_24a0;
            auVar72._24_8_ = local_24a0;
            auVar106 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar102 + 0x40 + (uVar101 ^ 0x20)),
                                       auVar71,auVar72);
            auVar152 = vpminsd_avx2(ZEXT1632(auVar106),_local_2ae0);
            auVar107 = vpminsd_avx2(auVar107,auVar152);
            auVar107 = vcmpps_avx(local_2960,auVar107,2);
            iVar93 = vmovmskps_avx(auVar107);
            if (iVar93 == 0) goto LAB_00635200;
            uVar98 = (ulong)(byte)iVar93;
            auVar115 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            uVar94 = 0;
            uVar92 = 8;
            do {
              lVar99 = 0;
              for (uVar103 = uVar98; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000
                  ) {
                lVar99 = lVar99 + 1;
              }
              uVar91 = *(undefined4 *)(uVar102 + 0x40 + lVar99 * 4);
              auVar118._4_4_ = uVar91;
              auVar118._0_4_ = uVar91;
              auVar118._8_4_ = uVar91;
              auVar118._12_4_ = uVar91;
              auVar118._16_4_ = uVar91;
              auVar118._20_4_ = uVar91;
              auVar118._24_4_ = uVar91;
              auVar118._28_4_ = uVar91;
              uVar91 = *(undefined4 *)(uVar102 + 0x80 + lVar99 * 4);
              auVar131._4_4_ = uVar91;
              auVar131._0_4_ = uVar91;
              auVar131._8_4_ = uVar91;
              auVar131._12_4_ = uVar91;
              auVar131._16_4_ = uVar91;
              auVar131._20_4_ = uVar91;
              auVar131._24_4_ = uVar91;
              auVar131._28_4_ = uVar91;
              auVar106 = vfmadd213ps_fma(auVar118,auVar140,auVar32);
              auVar13 = vfmadd213ps_fma(auVar131,auVar141,auVar174._0_32_);
              auVar121 = auVar159._0_32_;
              uVar91 = *(undefined4 *)(uVar102 + 0xc0 + lVar99 * 4);
              auVar137._4_4_ = uVar91;
              auVar137._0_4_ = uVar91;
              auVar137._8_4_ = uVar91;
              auVar137._12_4_ = uVar91;
              auVar137._16_4_ = uVar91;
              auVar137._20_4_ = uVar91;
              auVar137._24_4_ = uVar91;
              auVar137._28_4_ = uVar91;
              auVar34 = vfmadd213ps_fma(auVar137,auVar146,auVar33);
              uVar91 = *(undefined4 *)(uVar102 + 0x60 + lVar99 * 4);
              auVar149._4_4_ = uVar91;
              auVar149._0_4_ = uVar91;
              auVar149._8_4_ = uVar91;
              auVar149._12_4_ = uVar91;
              auVar149._16_4_ = uVar91;
              auVar149._20_4_ = uVar91;
              auVar149._24_4_ = uVar91;
              auVar149._28_4_ = uVar91;
              auVar35 = vfmadd213ps_fma(auVar149,auVar140,auVar32);
              uVar91 = *(undefined4 *)(uVar102 + 0xa0 + lVar99 * 4);
              auVar153._4_4_ = uVar91;
              auVar153._0_4_ = uVar91;
              auVar153._8_4_ = uVar91;
              auVar153._12_4_ = uVar91;
              auVar153._16_4_ = uVar91;
              auVar153._20_4_ = uVar91;
              auVar153._24_4_ = uVar91;
              auVar153._28_4_ = uVar91;
              uVar91 = *(undefined4 *)(uVar102 + 0xe0 + lVar99 * 4);
              auVar170._4_4_ = uVar91;
              auVar170._0_4_ = uVar91;
              auVar170._8_4_ = uVar91;
              auVar170._12_4_ = uVar91;
              auVar170._16_4_ = uVar91;
              auVar170._20_4_ = uVar91;
              auVar170._24_4_ = uVar91;
              auVar170._28_4_ = uVar91;
              auVar36 = vfmadd213ps_fma(auVar153,auVar141,auVar174._0_32_);
              auVar37 = vfmadd213ps_fma(auVar170,auVar146,auVar33);
              auVar107 = vpminsd_avx2(ZEXT1632(auVar106),ZEXT1632(auVar35));
              auVar152 = vpminsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar36));
              auVar107 = vpmaxsd_avx2(auVar107,auVar152);
              auVar152 = vpminsd_avx2(ZEXT1632(auVar34),ZEXT1632(auVar37));
              auVar152 = vpmaxsd_avx2(auVar152,auVar10);
              auVar107 = vpmaxsd_avx2(auVar107,auVar152);
              auVar152 = vpmaxsd_avx2(ZEXT1632(auVar106),ZEXT1632(auVar35));
              auVar136 = vpmaxsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar36));
              auVar136 = vpminsd_avx2(auVar152,auVar136);
              auVar152 = vpmaxsd_avx2(ZEXT1632(auVar34),ZEXT1632(auVar37));
              auVar159 = ZEXT3264(auVar121);
              auVar152 = vpminsd_avx2(auVar152,auVar121);
              auVar152 = vpminsd_avx2(auVar136,auVar152);
              auVar107 = vcmpps_avx(auVar107,auVar152,2);
              uVar103 = uVar92;
              if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar107 >> 0x7f,0) != '\0') ||
                    (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar107 >> 0xbf,0) != '\0') ||
                  (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar107[0x1f] < '\0') {
                uVar91 = *(undefined4 *)(local_2960 + lVar99 * 4);
                auVar106._4_4_ = uVar91;
                auVar106._0_4_ = uVar91;
                auVar106._8_4_ = uVar91;
                auVar106._12_4_ = uVar91;
                auVar119._16_4_ = uVar91;
                auVar119._0_16_ = auVar106;
                auVar119._20_4_ = uVar91;
                auVar119._24_4_ = uVar91;
                auVar119._28_4_ = uVar91;
                uVar103 = *(ulong *)(uVar102 + lVar99 * 8);
                auVar107 = vcmpps_avx(auVar119,auVar115._0_32_,1);
                if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar107 >> 0x7f,0) == '\0') &&
                      (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar107 >> 0xbf,0) == '\0') &&
                    (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar107[0x1f]) {
                  *puVar100 = uVar103;
                  uVar103 = uVar92;
                }
                else {
                  if (uVar92 == 8) {
                    auVar115 = ZEXT3264(auVar119);
                    goto LAB_00634624;
                  }
                  *puVar100 = uVar92;
                  auVar106 = auVar115._0_16_;
                  auVar115 = ZEXT3264(auVar119);
                }
                uVar94 = uVar94 + 1;
                *(int *)(puVar100 + 1) = auVar106._0_4_;
                puVar100 = puVar100 + 2;
              }
LAB_00634624:
              uVar98 = uVar98 - 1 & uVar98;
              uVar92 = uVar103;
            } while (uVar98 != 0);
            if (uVar103 == 8) goto LAB_00635200;
            uVar102 = uVar103;
            if (1 < uVar94) {
              puVar1 = puVar100 + -4;
              puVar2 = puVar100 + -2;
              if ((uint)puVar100[-3] < (uint)puVar100[-1]) {
                uVar92 = *puVar1;
                uVar98 = puVar100[-3];
                *(int *)(puVar100 + -3) = (int)puVar100[-1];
                *puVar1 = *puVar2;
                *puVar2 = uVar92;
                uStack_2b48 = (undefined4)uVar98;
                *(undefined4 *)(puVar100 + -1) = uStack_2b48;
              }
              if (uVar94 != 2) {
                puVar3 = puVar100 + -6;
                uVar116 = (uint)puVar100[-5];
                if (uVar116 < (uint)puVar100[-1]) {
                  uVar92 = *puVar3;
                  uVar94 = puVar100[-5];
                  *(int *)(puVar100 + -5) = (int)puVar100[-1];
                  *puVar3 = *puVar2;
                  *puVar2 = uVar92;
                  uStack_2b48 = (undefined4)uVar94;
                  *(undefined4 *)(puVar100 + -1) = uStack_2b48;
                  uVar116 = (uint)puVar100[-5];
                }
                if (uVar116 < (uint)puVar100[-3]) {
                  uVar92 = *puVar3;
                  uVar94 = puVar100[-5];
                  *(int *)(puVar100 + -5) = (int)puVar100[-3];
                  *puVar3 = *puVar1;
                  *puVar1 = uVar92;
                  uStack_2b48 = (undefined4)uVar94;
                  *(undefined4 *)(puVar100 + -3) = uStack_2b48;
                }
              }
            }
          }
          local_25c0 = auVar159._0_32_;
          auVar107 = vcmpps_avx(local_25c0,auVar115._0_32_,6);
          if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar107 >> 0x7f,0) != '\0') ||
                (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0xbf,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar107[0x1f] < '\0') {
            uVar92 = (ulong)((uint)uVar102 & 0xf);
            if (uVar92 != 8) {
              local_26e0 = *(undefined8 *)ray;
              uStack_26d8 = *(undefined8 *)(ray + 8);
              uStack_26d0 = *(undefined8 *)(ray + 0x10);
              uStack_26c8 = *(undefined8 *)(ray + 0x18);
              pRVar4 = ray + 0x20;
              local_2700 = *(undefined8 *)pRVar4;
              uStack_26f8 = *(undefined8 *)(ray + 0x28);
              uStack_26f0 = *(undefined8 *)(ray + 0x30);
              uStack_26e8 = *(undefined8 *)(ray + 0x38);
              pRVar5 = ray + 0x40;
              local_2720 = *(undefined8 *)pRVar5;
              uStack_2718 = *(undefined8 *)(ray + 0x48);
              uStack_2710 = *(undefined8 *)(ray + 0x50);
              uStack_2708 = *(undefined8 *)(ray + 0x58);
              uVar64 = *(undefined8 *)(ray + 0x60);
              uVar65 = *(undefined8 *)(ray + 0x68);
              uVar66 = *(undefined8 *)(ray + 0x70);
              local_27a0 = uVar64;
              uStack_2798 = uVar65;
              uStack_2790 = uVar66;
              uStack_2788 = *(undefined8 *)(ray + 0x78);
              pRVar7 = ray + 0xa0;
              auVar81 = *(undefined1 (*) [24])pRVar7;
              auVar80 = *(undefined1 (*) [24])pRVar7;
              local_2740 = *(undefined8 *)pRVar7;
              uStack_2738 = *(undefined8 *)(ray + 0xa8);
              uStack_2730 = *(undefined8 *)(ray + 0xb0);
              uStack_2728 = *(undefined8 *)(ray + 0xb8);
              local_2760 = *(undefined1 (*) [32])(ray + 0xc0);
              pRVar8 = ray + 0x80;
              auVar82 = *(undefined1 (*) [24])pRVar8;
              auVar79 = *(undefined1 (*) [24])pRVar8;
              local_2780 = *(undefined8 *)pRVar8;
              uStack_2778 = *(undefined8 *)(ray + 0x88);
              uStack_2770 = *(undefined8 *)(ray + 0x90);
              uStack_2768 = *(undefined8 *)(ray + 0x98);
              local_27c0 = *(undefined1 (*) [32])(ray + 0x120);
              lVar99 = (uVar102 & 0xfffffffffffffff0) + 0xc0;
              lVar96 = 0;
              do {
                lVar95 = 0;
                do {
                  uVar116 = *(uint *)(lVar99 + lVar95 * 4);
                  if ((ulong)uVar116 == 0xffffffff) break;
                  fVar162 = *(float *)(lVar99 + -0xc0 + lVar95 * 4);
                  auVar171._4_4_ = fVar162;
                  auVar171._0_4_ = fVar162;
                  auVar171._8_4_ = fVar162;
                  auVar171._12_4_ = fVar162;
                  auVar171._16_4_ = fVar162;
                  auVar171._20_4_ = fVar162;
                  auVar171._24_4_ = fVar162;
                  auVar171._28_4_ = fVar162;
                  fVar165 = *(float *)(lVar99 + -0xb0 + lVar95 * 4);
                  auVar148._4_4_ = fVar165;
                  auVar148._0_4_ = fVar165;
                  auVar148._8_4_ = fVar165;
                  auVar148._12_4_ = fVar165;
                  auVar148._16_4_ = fVar165;
                  auVar148._20_4_ = fVar165;
                  auVar148._24_4_ = fVar165;
                  auVar148._28_4_ = fVar165;
                  fVar161 = *(float *)(lVar99 + -0xa0 + lVar95 * 4);
                  auVar154._4_4_ = fVar161;
                  auVar154._0_4_ = fVar161;
                  auVar154._8_4_ = fVar161;
                  auVar154._12_4_ = fVar161;
                  auVar154._16_4_ = fVar161;
                  auVar154._20_4_ = fVar161;
                  auVar154._24_4_ = fVar161;
                  auVar154._28_4_ = fVar161;
                  local_28a0._4_4_ = *(float *)(lVar99 + -0x90 + lVar95 * 4);
                  local_28c0._4_4_ = *(float *)(lVar99 + -0x80 + lVar95 * 4);
                  local_2ae0._4_4_ = *(float *)(lVar99 + -0x70 + lVar95 * 4);
                  local_2ae0._0_4_ = local_2ae0._4_4_;
                  fStack_2ad8 = (float)local_2ae0._4_4_;
                  fStack_2ad4 = (float)local_2ae0._4_4_;
                  fStack_2ad0 = (float)local_2ae0._4_4_;
                  fStack_2acc = (float)local_2ae0._4_4_;
                  fStack_2ac8 = (float)local_2ae0._4_4_;
                  fStack_2ac4 = (float)local_2ae0._4_4_;
                  local_2a20._4_4_ = *(undefined4 *)(lVar99 + -0x60 + lVar95 * 4);
                  local_2a20._0_4_ = local_2a20._4_4_;
                  fStack_2a18 = (float)local_2a20._4_4_;
                  fStack_2a14 = (float)local_2a20._4_4_;
                  fStack_2a10 = (float)local_2a20._4_4_;
                  fStack_2a0c = (float)local_2a20._4_4_;
                  fStack_2a08 = (float)local_2a20._4_4_;
                  uStack_2a04 = local_2a20._4_4_;
                  local_29a0._4_4_ = *(undefined4 *)(lVar99 + -0x50 + lVar95 * 4);
                  local_29a0._0_4_ = local_29a0._4_4_;
                  local_29a0._8_4_ = local_29a0._4_4_;
                  local_29a0._12_4_ = local_29a0._4_4_;
                  local_29a0._16_4_ = local_29a0._4_4_;
                  local_29a0._20_4_ = local_29a0._4_4_;
                  local_29a0._24_4_ = local_29a0._4_4_;
                  local_29a0._28_4_ = local_29a0._4_4_;
                  local_29c0._4_4_ = *(undefined4 *)(lVar99 + -0x40 + lVar95 * 4);
                  local_29c0._0_4_ = local_29c0._4_4_;
                  local_29c0._8_4_ = local_29c0._4_4_;
                  local_29c0._12_4_ = local_29c0._4_4_;
                  local_29c0._16_4_ = local_29c0._4_4_;
                  local_29c0._20_4_ = local_29c0._4_4_;
                  local_29c0._24_4_ = local_29c0._4_4_;
                  local_29c0._28_4_ = local_29c0._4_4_;
                  local_28e0._4_4_ = *(float *)(lVar99 + -0x30 + lVar95 * 4);
                  local_2900._4_4_ = *(float *)(lVar99 + -0x20 + lVar95 * 4);
                  local_2920._4_4_ = *(float *)(lVar99 + -0x10 + lVar95 * 4);
                  local_2960._0_16_ =
                       *(undefined1 (*) [16])(lVar96 * 0xe0 + (uVar102 & 0xfffffffffffffff0) + 0xd0)
                  ;
                  local_28a0._0_4_ = local_28a0._4_4_;
                  fStack_2898 = (float)local_28a0._4_4_;
                  fStack_2894 = (float)local_28a0._4_4_;
                  fStack_2890 = (float)local_28a0._4_4_;
                  fStack_288c = (float)local_28a0._4_4_;
                  fStack_2888 = (float)local_28a0._4_4_;
                  fStack_2884 = (float)local_28a0._4_4_;
                  fVar22 = fVar162 - (float)local_28a0._4_4_;
                  local_2500._4_4_ = fVar22;
                  local_2500._0_4_ = fVar22;
                  local_2500._8_4_ = fVar22;
                  local_2500._12_4_ = fVar22;
                  local_2500._16_4_ = fVar22;
                  local_2500._20_4_ = fVar22;
                  local_2500._24_4_ = fVar22;
                  local_2500._28_4_ = fVar22;
                  local_28c0._0_4_ = local_28c0._4_4_;
                  fStack_28b8 = (float)local_28c0._4_4_;
                  fStack_28b4 = (float)local_28c0._4_4_;
                  fStack_28b0 = (float)local_28c0._4_4_;
                  fStack_28ac = (float)local_28c0._4_4_;
                  fStack_28a8 = (float)local_28c0._4_4_;
                  fStack_28a4 = (float)local_28c0._4_4_;
                  fVar23 = fVar165 - (float)local_28c0._4_4_;
                  local_2900._0_4_ = local_2900._4_4_;
                  fStack_28f8 = (float)local_2900._4_4_;
                  fStack_28f4 = (float)local_2900._4_4_;
                  fStack_28f0 = (float)local_2900._4_4_;
                  fStack_28ec = (float)local_2900._4_4_;
                  fStack_28e8 = (float)local_2900._4_4_;
                  fStack_28e4 = (float)local_2900._4_4_;
                  fVar165 = (float)local_2900._4_4_ - fVar165;
                  fVar22 = fVar165 * fVar22;
                  auVar138._4_4_ = fVar165;
                  auVar138._0_4_ = fVar165;
                  auVar138._8_4_ = fVar165;
                  auVar138._12_4_ = fVar165;
                  auVar138._16_4_ = fVar165;
                  auVar138._20_4_ = fVar165;
                  auVar138._24_4_ = fVar165;
                  auVar138._28_4_ = fVar165;
                  local_2920._0_4_ = local_2920._4_4_;
                  fStack_2918 = (float)local_2920._4_4_;
                  fStack_2914 = (float)local_2920._4_4_;
                  fStack_2910 = (float)local_2920._4_4_;
                  fStack_290c = (float)local_2920._4_4_;
                  fStack_2908 = (float)local_2920._4_4_;
                  fStack_2904 = (float)local_2920._4_4_;
                  fVar24 = (float)local_2920._4_4_ - fVar161;
                  auVar163._4_4_ = fVar24;
                  auVar163._0_4_ = fVar24;
                  auVar163._8_4_ = fVar24;
                  auVar163._12_4_ = fVar24;
                  auVar163._16_4_ = fVar24;
                  auVar163._20_4_ = fVar24;
                  auVar163._24_4_ = fVar24;
                  auVar163._28_4_ = fVar24;
                  fVar165 = fVar24 * fVar23;
                  auVar120._4_4_ = fVar165;
                  auVar120._0_4_ = fVar165;
                  auVar120._8_4_ = fVar165;
                  auVar120._12_4_ = fVar165;
                  auVar120._16_4_ = fVar165;
                  auVar120._20_4_ = fVar165;
                  auVar120._24_4_ = fVar165;
                  auVar120._28_4_ = fVar165;
                  fVar161 = fVar161 - (float)local_2ae0._4_4_;
                  local_2520._4_4_ = fVar161;
                  local_2520._0_4_ = fVar161;
                  local_2520._8_4_ = fVar161;
                  local_2520._12_4_ = fVar161;
                  local_2520._16_4_ = fVar161;
                  local_2520._20_4_ = fVar161;
                  local_2520._24_4_ = fVar161;
                  local_2520._28_4_ = fVar161;
                  auVar106 = vfmsub231ps_fma(auVar120,auVar138,local_2520);
                  auVar121 = ZEXT1632(auVar106);
                  local_28e0._0_4_ = local_28e0._4_4_;
                  fStack_28d8 = (float)local_28e0._4_4_;
                  fStack_28d4 = (float)local_28e0._4_4_;
                  fStack_28d0 = (float)local_28e0._4_4_;
                  fStack_28cc = (float)local_28e0._4_4_;
                  fStack_28c8 = (float)local_28e0._4_4_;
                  fStack_28c4 = (float)local_28e0._4_4_;
                  fVar160 = (float)local_28e0._4_4_ - fVar162;
                  fVar165 = fVar161 * fVar160;
                  auVar150._4_4_ = fVar165;
                  auVar150._0_4_ = fVar165;
                  auVar150._8_4_ = fVar165;
                  auVar150._12_4_ = fVar165;
                  auVar150._16_4_ = fVar165;
                  auVar150._20_4_ = fVar165;
                  auVar150._24_4_ = fVar165;
                  auVar150._28_4_ = fVar165;
                  auVar13 = vfmsub231ps_fma(auVar150,auVar163,local_2500);
                  local_2580 = vsubps_avx(auVar171,*(undefined1 (*) [32])ray);
                  local_2940 = vsubps_avx(auVar148,*(undefined1 (*) [32])pRVar4);
                  local_25a0 = vsubps_avx(auVar154,*(undefined1 (*) [32])pRVar5);
                  fVar165 = local_2760._0_4_;
                  fVar168 = local_2760._4_4_;
                  auVar41._4_4_ = local_2580._4_4_ * fVar168;
                  auVar41._0_4_ = local_2580._0_4_ * fVar165;
                  fVar16 = local_2760._8_4_;
                  auVar41._8_4_ = local_2580._8_4_ * fVar16;
                  fVar17 = local_2760._12_4_;
                  auVar41._12_4_ = local_2580._12_4_ * fVar17;
                  fVar18 = local_2760._16_4_;
                  auVar41._16_4_ = local_2580._16_4_ * fVar18;
                  fVar19 = local_2760._20_4_;
                  auVar41._20_4_ = local_2580._20_4_ * fVar19;
                  fVar20 = local_2760._24_4_;
                  auVar41._24_4_ = local_2580._24_4_ * fVar20;
                  auVar41._28_4_ = fVar162;
                  auVar106 = vfmsub231ps_fma(auVar41,local_25a0,*(undefined1 (*) [32])pRVar8);
                  auVar42._4_4_ = local_2940._4_4_ * auVar79._4_4_;
                  auVar42._0_4_ = local_2940._0_4_ * auVar79._0_4_;
                  auVar42._8_4_ = local_2940._8_4_ * auVar79._8_4_;
                  auVar42._12_4_ = local_2940._12_4_ * auVar79._12_4_;
                  auVar42._16_4_ = local_2940._16_4_ * auVar79._16_4_;
                  auVar42._20_4_ = local_2940._20_4_ * auVar79._20_4_;
                  fVar162 = (float)*(undefined8 *)(ray + 0x98);
                  auVar42._24_4_ = local_2940._24_4_ * fVar162;
                  auVar42._28_4_ = (int)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
                  auVar34 = vfmsub231ps_fma(auVar42,local_2580,*(undefined1 (*) [32])pRVar7);
                  local_2560 = ZEXT1632(auVar34);
                  auVar43._4_4_ = fVar24 * auVar34._4_4_;
                  auVar43._0_4_ = fVar24 * auVar34._0_4_;
                  auVar43._8_4_ = fVar24 * auVar34._8_4_;
                  auVar43._12_4_ = fVar24 * auVar34._12_4_;
                  auVar43._16_4_ = fVar24 * 0.0;
                  auVar43._20_4_ = fVar24 * 0.0;
                  auVar43._24_4_ = fVar24 * 0.0;
                  auVar43._28_4_ = fVar24;
                  local_2540 = ZEXT1632(auVar106);
                  auVar106 = vfmadd231ps_fma(auVar43,local_2540,auVar138);
                  auVar122._4_4_ = fVar23;
                  auVar122._0_4_ = fVar23;
                  auVar122._8_4_ = fVar23;
                  auVar122._12_4_ = fVar23;
                  auVar122._16_4_ = fVar23;
                  auVar122._20_4_ = fVar23;
                  auVar122._24_4_ = fVar23;
                  auVar122._28_4_ = fVar23;
                  auVar109._4_4_ = fVar160;
                  auVar109._0_4_ = fVar160;
                  auVar109._8_4_ = fVar160;
                  auVar109._12_4_ = fVar160;
                  auVar109._16_4_ = fVar160;
                  auVar109._20_4_ = fVar160;
                  auVar109._24_4_ = fVar160;
                  auVar109._28_4_ = fVar160;
                  auVar172._4_4_ = fVar22;
                  auVar172._0_4_ = fVar22;
                  auVar172._8_4_ = fVar22;
                  auVar172._12_4_ = fVar22;
                  auVar172._16_4_ = fVar22;
                  auVar172._20_4_ = fVar22;
                  auVar172._24_4_ = fVar22;
                  auVar172._28_4_ = fVar22;
                  auVar35 = vfmsub231ps_fma(auVar172,auVar109,auVar122);
                  auVar44._4_4_ = auVar80._4_4_ * local_25a0._4_4_;
                  auVar44._0_4_ = auVar80._0_4_ * local_25a0._0_4_;
                  auVar44._8_4_ = auVar80._8_4_ * local_25a0._8_4_;
                  auVar44._12_4_ = auVar80._12_4_ * local_25a0._12_4_;
                  auVar44._16_4_ = auVar80._16_4_ * local_25a0._16_4_;
                  auVar44._20_4_ = auVar80._20_4_ * local_25a0._20_4_;
                  fVar160 = (float)*(undefined8 *)(ray + 0xb8);
                  auVar44._24_4_ = fVar160 * local_25a0._24_4_;
                  auVar44._28_4_ = local_25a0._28_4_;
                  auVar36 = vfmsub231ps_fma(auVar44,local_2940,local_2760);
                  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar36),auVar109);
                  auVar45._4_4_ = auVar35._4_4_ * fVar168;
                  auVar45._0_4_ = auVar35._0_4_ * fVar165;
                  auVar45._8_4_ = auVar35._8_4_ * fVar16;
                  auVar45._12_4_ = auVar35._12_4_ * fVar17;
                  auVar45._16_4_ = fVar18 * 0.0;
                  auVar45._20_4_ = fVar19 * 0.0;
                  auVar45._24_4_ = fVar20 * 0.0;
                  auVar45._28_4_ = local_2940._28_4_;
                  auVar151 = ZEXT1632(auVar13);
                  auVar13 = vfmadd231ps_fma(auVar45,auVar151,*(undefined1 (*) [32])pRVar7);
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),*(undefined1 (*) [32])pRVar8,auVar121)
                  ;
                  auVar67._8_4_ = 0x80000000;
                  auVar67._0_8_ = 0x8000000080000000;
                  auVar67._12_4_ = 0x80000000;
                  auVar67._16_4_ = 0x80000000;
                  auVar67._20_4_ = 0x80000000;
                  auVar67._24_4_ = 0x80000000;
                  auVar67._28_4_ = 0x80000000;
                  auVar152 = vandps_avx(ZEXT1632(auVar13),auVar67);
                  uVar128 = auVar152._0_4_;
                  auVar155._0_4_ = (float)(auVar106._0_4_ ^ uVar128);
                  uVar129 = auVar152._4_4_;
                  auVar155._4_4_ = (float)(auVar106._4_4_ ^ uVar129);
                  uVar130 = auVar152._8_4_;
                  auVar155._8_4_ = (float)(auVar106._8_4_ ^ uVar130);
                  uVar31 = auVar152._12_4_;
                  auVar155._12_4_ = (float)(auVar106._12_4_ ^ uVar31);
                  fVar22 = auVar152._16_4_;
                  auVar155._16_4_ = fVar22;
                  fVar23 = auVar152._20_4_;
                  auVar155._20_4_ = fVar23;
                  fVar24 = auVar152._24_4_;
                  auVar155._24_4_ = fVar24;
                  uVar91 = auVar152._28_4_;
                  auVar155._28_4_ = uVar91;
                  auVar152 = vcmpps_avx(auVar155,ZEXT832(0) << 0x20,5);
                  auVar136 = auVar107 & auVar152;
                  local_27a0._0_4_ = (float)uVar64;
                  local_27a0._4_4_ = (float)((ulong)uVar64 >> 0x20);
                  uStack_2798._0_4_ = (float)uVar65;
                  uStack_2798._4_4_ = (float)((ulong)uVar65 >> 0x20);
                  uStack_2790._0_4_ = (float)uVar66;
                  uStack_2790._4_4_ = (float)((ulong)uVar66 >> 0x20);
                  uStack_2788._0_4_ = (float)*(undefined8 *)(ray + 0x78);
                  if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar136 >> 0x7f,0) != '\0') ||
                        (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar136 >> 0xbf,0) != '\0') ||
                      (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar136[0x1f] < '\0') {
                    auVar152 = vandps_avx(auVar152,auVar107);
                    auVar106 = vpackssdw_avx(auVar152._0_16_,auVar152._16_16_);
                    auVar52._4_4_ = auVar34._4_4_ * fVar161;
                    auVar52._0_4_ = auVar34._0_4_ * fVar161;
                    auVar52._8_4_ = auVar34._8_4_ * fVar161;
                    auVar52._12_4_ = auVar34._12_4_ * fVar161;
                    auVar52._16_4_ = fVar161 * 0.0;
                    auVar52._20_4_ = fVar161 * 0.0;
                    auVar52._24_4_ = fVar161 * 0.0;
                    auVar52._28_4_ = 0;
                    auVar34 = vfmadd132ps_fma(auVar122,auVar52,local_2540);
                    auVar34 = vfmadd213ps_fma(local_2500,ZEXT1632(auVar36),ZEXT1632(auVar34));
                    auVar173._0_4_ = (float)(uVar128 ^ auVar34._0_4_);
                    auVar173._4_4_ = (float)(uVar129 ^ auVar34._4_4_);
                    auVar173._8_4_ = (float)(uVar130 ^ auVar34._8_4_);
                    auVar173._12_4_ = (float)(uVar31 ^ auVar34._12_4_);
                    auVar173._16_4_ = fVar22;
                    auVar173._20_4_ = fVar23;
                    auVar173._24_4_ = fVar24;
                    auVar173._28_4_ = uVar91;
                    auVar152 = vcmpps_avx(auVar173,ZEXT832(0) << 0x20,5);
                    auVar34 = vpackssdw_avx(auVar152._0_16_,auVar152._16_16_);
                    auVar106 = vpand_avx(auVar106,auVar34);
                    auVar152 = vpmovsxwd_avx2(auVar106);
                    if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar152 >> 0x7f,0) != '\0') ||
                          (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar152 >> 0xbf,0) != '\0') ||
                        (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar152[0x1f] < '\0') {
                      auVar152 = vandps_avx(ZEXT1632(auVar13),local_2800);
                      auVar136 = vsubps_avx(auVar152,auVar155);
                      auVar136 = vcmpps_avx(auVar136,auVar173,5);
                      auVar34 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
                      auVar106 = vpand_avx(auVar106,auVar34);
                      auVar136 = vpmovsxwd_avx2(auVar106);
                      if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar136 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar136 >> 0x7f,0) != '\0') ||
                            (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar136 >> 0xbf,0) != '\0') ||
                          (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar136[0x1f] < '\0') {
                        auVar53._4_4_ = local_25a0._4_4_ * auVar35._4_4_;
                        auVar53._0_4_ = local_25a0._0_4_ * auVar35._0_4_;
                        auVar53._8_4_ = local_25a0._8_4_ * auVar35._8_4_;
                        auVar53._12_4_ = local_25a0._12_4_ * auVar35._12_4_;
                        auVar53._16_4_ = local_25a0._16_4_ * 0.0;
                        auVar53._20_4_ = local_25a0._20_4_ * 0.0;
                        auVar53._24_4_ = local_25a0._24_4_ * 0.0;
                        auVar53._28_4_ = local_25a0._28_4_;
                        auVar34 = vfmadd132ps_fma(local_2940,auVar53,auVar151);
                        auVar34 = vfmadd132ps_fma(local_2580,ZEXT1632(auVar34),auVar121);
                        auVar111._0_4_ = (float)(uVar128 ^ auVar34._0_4_);
                        auVar111._4_4_ = (float)(uVar129 ^ auVar34._4_4_);
                        auVar111._8_4_ = (float)(uVar130 ^ auVar34._8_4_);
                        auVar111._12_4_ = (float)(uVar31 ^ auVar34._12_4_);
                        auVar111._16_4_ = fVar22;
                        auVar111._20_4_ = fVar23;
                        auVar111._24_4_ = fVar24;
                        auVar111._28_4_ = uVar91;
                        local_2ac0 = auVar152._0_4_;
                        fStack_2abc = auVar152._4_4_;
                        fStack_2ab8 = auVar152._8_4_;
                        fStack_2ab4 = auVar152._12_4_;
                        fStack_2ab0 = auVar152._16_4_;
                        fStack_2aac = auVar152._20_4_;
                        fStack_2aa8 = auVar152._24_4_;
                        auVar123._0_4_ = local_2ac0 * (float)local_27a0;
                        auVar123._4_4_ = fStack_2abc * local_27a0._4_4_;
                        auVar123._8_4_ = fStack_2ab8 * (float)uStack_2798;
                        auVar123._12_4_ = fStack_2ab4 * uStack_2798._4_4_;
                        auVar123._16_4_ = fStack_2ab0 * (float)uStack_2790;
                        auVar123._20_4_ = fStack_2aac * uStack_2790._4_4_;
                        auVar123._24_4_ = fStack_2aa8 * (float)uStack_2788;
                        auVar123._28_4_ = 0;
                        auVar54._4_4_ = fStack_2abc * *(float *)(ray + 0x104);
                        auVar54._0_4_ = local_2ac0 * *(float *)pRVar6;
                        auVar54._8_4_ = fStack_2ab8 * *(float *)(ray + 0x108);
                        auVar54._12_4_ = fStack_2ab4 * *(float *)(ray + 0x10c);
                        auVar54._16_4_ = fStack_2ab0 * *(float *)(ray + 0x110);
                        auVar54._20_4_ = fStack_2aac * *(float *)(ray + 0x114);
                        auVar54._24_4_ = fStack_2aa8 * *(float *)(ray + 0x118);
                        auVar54._28_4_ = uVar91;
                        auVar136 = vcmpps_avx(auVar123,auVar111,1);
                        auVar169 = vcmpps_avx(auVar111,auVar54,2);
                        auVar136 = vandps_avx(auVar136,auVar169);
                        auVar34 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
                        auVar106 = vpand_avx(auVar34,auVar106);
                        auVar136 = vpmovsxwd_avx2(auVar106);
                        if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar136 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar136 >> 0x7f,0) != '\0')
                              || (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar136 >> 0xbf,0) != '\0') ||
                            (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar136[0x1f] < '\0') {
                          auVar136 = vcmpps_avx(ZEXT1632(auVar13),ZEXT832(0) << 0x20,4);
                          auVar13 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
                          auVar106 = vpand_avx(auVar106,auVar13);
                          auVar136 = vpmovsxwd_avx2(auVar106);
                          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar136 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar136 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar136 >> 0x7f,0) != '\0') ||
                                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar136 >> 0xbf,0) != '\0') ||
                              (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar136[0x1f] < '\0') {
                            uVar128 = ((context->scene->geometries).items[uVar116].ptr)->mask;
                            auVar132._4_4_ = uVar128;
                            auVar132._0_4_ = uVar128;
                            auVar132._8_4_ = uVar128;
                            auVar132._12_4_ = uVar128;
                            auVar132._16_4_ = uVar128;
                            auVar132._20_4_ = uVar128;
                            auVar132._24_4_ = uVar128;
                            auVar132._28_4_ = uVar128;
                            auVar136 = vpand_avx2(auVar132,local_27c0);
                            auVar136 = vpcmpeqd_avx2(ZEXT832(0) << 0x20,auVar136);
                            auVar13 = vpackssdw_avx(SUB3216(auVar136 ^ _DAT_01fe9960,0),
                                                    SUB3216(auVar136 ^ _DAT_01fe9960,0x10));
                            auVar106 = vpand_avx(auVar13,auVar106);
                            auVar136 = vpmovsxwd_avx2(auVar106);
                            if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar136 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar136 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar136 >> 0x7f,0) != '\0') ||
                                  (auVar136 & (undefined1  [32])0x100000000) !=
                                  (undefined1  [32])0x0) || SUB321(auVar136 >> 0xbf,0) != '\0') ||
                                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar136[0x1f] < '\0') {
                              auVar169 = vrcpps_avx(auVar152);
                              auVar142._8_4_ = 0x3f800000;
                              auVar142._0_8_ = 0x3f8000003f800000;
                              auVar142._12_4_ = 0x3f800000;
                              auVar142._16_4_ = 0x3f800000;
                              auVar142._20_4_ = 0x3f800000;
                              auVar142._24_4_ = 0x3f800000;
                              auVar142._28_4_ = 0x3f800000;
                              auVar106 = vfnmadd213ps_fma(auVar152,auVar169,auVar142);
                              auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar169,auVar169);
                              fVar161 = auVar106._0_4_;
                              fVar164 = auVar106._4_4_;
                              auVar55._4_4_ = fVar164 * auVar173._4_4_;
                              auVar55._0_4_ = fVar161 * auVar173._0_4_;
                              fVar166 = auVar106._8_4_;
                              auVar55._8_4_ = fVar166 * auVar173._8_4_;
                              fVar167 = auVar106._12_4_;
                              auVar55._12_4_ = fVar167 * auVar173._12_4_;
                              auVar55._16_4_ = fVar22 * 0.0;
                              auVar55._20_4_ = fVar23 * 0.0;
                              auVar55._24_4_ = fVar24 * 0.0;
                              auVar55._28_4_ = auVar169._28_4_;
                              auVar152 = vminps_avx(auVar55,auVar142);
                              auVar108 = vsubps_avx(auVar142,auVar152);
                              auVar70._8_8_ = uVar87;
                              auVar70._0_8_ = uVar86;
                              auVar70._16_8_ = uVar86;
                              auVar70._24_8_ = uVar87;
                              auVar169 = vblendvps_avx(auVar152,auVar108,auVar70);
                              auVar56._4_4_ = fVar164 * auVar155._4_4_;
                              auVar56._0_4_ = fVar161 * auVar155._0_4_;
                              auVar56._8_4_ = fVar166 * auVar155._8_4_;
                              auVar56._12_4_ = fVar167 * auVar155._12_4_;
                              auVar56._16_4_ = fVar22 * 0.0;
                              auVar56._20_4_ = fVar23 * 0.0;
                              auVar56._24_4_ = fVar24 * 0.0;
                              auVar56._28_4_ = auVar108._28_4_;
                              auVar152 = vminps_avx(auVar56,auVar142);
                              auVar108 = vsubps_avx(auVar142,auVar152);
                              auVar108 = vblendvps_avx(auVar152,auVar108,auVar70);
                              auVar57._4_4_ = fVar164 * auVar111._4_4_;
                              auVar57._0_4_ = fVar161 * auVar111._0_4_;
                              auVar57._8_4_ = fVar166 * auVar111._8_4_;
                              auVar57._12_4_ = fVar167 * auVar111._12_4_;
                              auVar57._16_4_ = fVar22 * 0.0;
                              auVar57._20_4_ = fVar23 * 0.0;
                              auVar57._24_4_ = fVar24 * 0.0;
                              auVar57._28_4_ = uVar91;
                              uVar9 = *(undefined4 *)(local_2960 + lVar95 * 4);
                              auVar143._4_4_ = uVar9;
                              auVar143._0_4_ = uVar9;
                              auVar143._8_4_ = uVar9;
                              auVar143._12_4_ = uVar9;
                              auVar143._16_4_ = uVar9;
                              auVar143._20_4_ = uVar9;
                              auVar143._24_4_ = uVar9;
                              auVar143._28_4_ = uVar9;
                              auVar152 = vmaskmovps_avx(auVar136,auVar57);
                              *(undefined1 (*) [32])pRVar6 = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,auVar121);
                              *(undefined1 (*) [32])(ray + 0x180) = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,auVar151);
                              *(undefined1 (*) [32])(ray + 0x1a0) = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,ZEXT1632(auVar35));
                              *(undefined1 (*) [32])(ray + 0x1c0) = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,auVar108);
                              *(undefined1 (*) [32])(ray + 0x1e0) = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,auVar169);
                              *(undefined1 (*) [32])(ray + 0x200) = auVar152;
                              auVar152 = vpmaskmovd_avx2(auVar136,auVar143);
                              *(undefined1 (*) [32])(ray + 0x220) = auVar152;
                              auVar112._4_4_ = uVar116;
                              auVar112._0_4_ = uVar116;
                              auVar112._8_4_ = uVar116;
                              auVar112._12_4_ = uVar116;
                              auVar112._16_4_ = uVar116;
                              auVar112._20_4_ = uVar116;
                              auVar112._24_4_ = uVar116;
                              auVar112._28_4_ = uVar116;
                              auVar152 = vpmaskmovd_avx2(auVar136,auVar112);
                              *(undefined1 (*) [32])(ray + 0x240) = auVar152;
                              uVar116 = context->user->instID[0];
                              auVar113._4_4_ = uVar116;
                              auVar113._0_4_ = uVar116;
                              auVar113._8_4_ = uVar116;
                              auVar113._12_4_ = uVar116;
                              auVar113._16_4_ = uVar116;
                              auVar113._20_4_ = uVar116;
                              auVar113._24_4_ = uVar116;
                              auVar113._28_4_ = uVar116;
                              auVar152 = vpmaskmovd_avx2(auVar136,auVar113);
                              *(undefined1 (*) [32])(ray + 0x260) = auVar152;
                              uVar116 = context->user->instPrimID[0];
                              auVar114._4_4_ = uVar116;
                              auVar114._0_4_ = uVar116;
                              auVar114._8_4_ = uVar116;
                              auVar114._12_4_ = uVar116;
                              auVar114._16_4_ = uVar116;
                              auVar114._20_4_ = uVar116;
                              auVar114._24_4_ = uVar116;
                              auVar114._28_4_ = uVar116;
                              auVar152 = vpmaskmovd_avx2(auVar136,auVar114);
                              *(undefined1 (*) [32])(ray + 0x280) = auVar152;
                            }
                          }
                        }
                      }
                    }
                  }
                  auVar136 = vsubps_avx(_local_2a20,_local_28e0);
                  auVar121 = vsubps_avx(local_29a0,_local_2900);
                  auVar151 = vsubps_avx(local_29c0,_local_2920);
                  _local_28a0 = vsubps_avx(_local_28a0,_local_2a20);
                  _local_28c0 = vsubps_avx(_local_28c0,local_29a0);
                  _local_28e0 = vsubps_avx(_local_2ae0,local_29c0);
                  auVar46._4_4_ = auVar121._4_4_ * local_28e0._4_4_;
                  auVar46._0_4_ = auVar121._0_4_ * local_28e0._0_4_;
                  auVar46._8_4_ = auVar121._8_4_ * local_28e0._8_4_;
                  auVar46._12_4_ = auVar121._12_4_ * local_28e0._12_4_;
                  auVar46._16_4_ = auVar121._16_4_ * local_28e0._16_4_;
                  auVar46._20_4_ = auVar121._20_4_ * local_28e0._20_4_;
                  auVar46._24_4_ = auVar121._24_4_ * local_28e0._24_4_;
                  auVar46._28_4_ = uVar91;
                  auVar106 = vfmsub231ps_fma(auVar46,_local_28c0,auVar151);
                  auVar156 = ZEXT1632(auVar106);
                  auVar157._0_4_ = auVar151._0_4_ * local_28a0._0_4_;
                  auVar157._4_4_ = auVar151._4_4_ * local_28a0._4_4_;
                  auVar157._8_4_ = auVar151._8_4_ * local_28a0._8_4_;
                  auVar157._12_4_ = auVar151._12_4_ * local_28a0._12_4_;
                  auVar157._16_4_ = auVar151._16_4_ * local_28a0._16_4_;
                  auVar157._20_4_ = auVar151._20_4_ * local_28a0._20_4_;
                  auVar157._24_4_ = auVar151._24_4_ * local_28a0._24_4_;
                  auVar157._28_4_ = 0;
                  auVar106 = vfmsub231ps_fma(auVar157,_local_28e0,auVar136);
                  _local_2900 = auVar136;
                  auVar47._4_4_ = local_28c0._4_4_ * auVar136._4_4_;
                  auVar47._0_4_ = local_28c0._0_4_ * auVar136._0_4_;
                  auVar47._8_4_ = local_28c0._8_4_ * auVar136._8_4_;
                  auVar47._12_4_ = local_28c0._12_4_ * auVar136._12_4_;
                  auVar47._16_4_ = local_28c0._16_4_ * auVar136._16_4_;
                  auVar47._20_4_ = local_28c0._20_4_ * auVar136._20_4_;
                  auVar47._24_4_ = local_28c0._24_4_ * auVar136._24_4_;
                  auVar47._28_4_ = local_28e0._28_4_;
                  _local_2920 = auVar121;
                  auVar34 = vfmsub231ps_fma(auVar47,_local_28a0,auVar121);
                  auVar169 = vsubps_avx(_local_2a20,*(undefined1 (*) [32])ray);
                  auVar108 = vsubps_avx(local_29a0,*(undefined1 (*) [32])pRVar4);
                  auVar21 = vsubps_avx(local_29c0,*(undefined1 (*) [32])pRVar5);
                  auVar48._4_4_ = auVar81._4_4_ * auVar21._4_4_;
                  auVar48._0_4_ = auVar81._0_4_ * auVar21._0_4_;
                  auVar48._8_4_ = auVar81._8_4_ * auVar21._8_4_;
                  auVar48._12_4_ = auVar81._12_4_ * auVar21._12_4_;
                  auVar48._16_4_ = auVar81._16_4_ * auVar21._16_4_;
                  auVar48._20_4_ = auVar81._20_4_ * auVar21._20_4_;
                  auVar48._24_4_ = fVar160 * auVar21._24_4_;
                  auVar48._28_4_ = auVar121._28_4_;
                  auVar35 = vfmsub231ps_fma(auVar48,auVar108,local_2760);
                  auVar49._4_4_ = fVar168 * auVar169._4_4_;
                  auVar49._0_4_ = fVar165 * auVar169._0_4_;
                  auVar49._8_4_ = fVar16 * auVar169._8_4_;
                  auVar49._12_4_ = fVar17 * auVar169._12_4_;
                  auVar49._16_4_ = fVar18 * auVar169._16_4_;
                  auVar49._20_4_ = fVar19 * auVar169._20_4_;
                  auVar49._24_4_ = fVar20 * auVar169._24_4_;
                  auVar49._28_4_ = local_28a0._28_4_;
                  auVar36 = vfmsub231ps_fma(auVar49,auVar21,*(undefined1 (*) [32])pRVar8);
                  auVar50._4_4_ = auVar82._4_4_ * auVar108._4_4_;
                  auVar50._0_4_ = auVar82._0_4_ * auVar108._0_4_;
                  auVar50._8_4_ = auVar82._8_4_ * auVar108._8_4_;
                  auVar50._12_4_ = auVar82._12_4_ * auVar108._12_4_;
                  auVar50._16_4_ = auVar82._16_4_ * auVar108._16_4_;
                  auVar50._20_4_ = auVar82._20_4_ * auVar108._20_4_;
                  auVar50._24_4_ = fVar162 * auVar108._24_4_;
                  auVar50._28_4_ = auVar108._28_4_;
                  auVar37 = vfmsub231ps_fma(auVar50,auVar169,*(undefined1 (*) [32])pRVar7);
                  auVar51._4_4_ = fVar168 * auVar34._4_4_;
                  auVar51._0_4_ = fVar165 * auVar34._0_4_;
                  auVar51._8_4_ = fVar16 * auVar34._8_4_;
                  auVar51._12_4_ = fVar17 * auVar34._12_4_;
                  auVar51._16_4_ = fVar18 * 0.0;
                  auVar51._20_4_ = fVar19 * 0.0;
                  auVar51._24_4_ = fVar20 * 0.0;
                  auVar51._28_4_ = local_2760._28_4_;
                  auVar158 = ZEXT1632(auVar106);
                  auVar106 = vfmadd231ps_fma(auVar51,auVar158,*(undefined1 (*) [32])pRVar7);
                  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar156,
                                             *(undefined1 (*) [32])pRVar8);
                  auVar110._0_4_ = auVar37._0_4_ * local_28e0._0_4_;
                  auVar110._4_4_ = auVar37._4_4_ * local_28e0._4_4_;
                  auVar110._8_4_ = auVar37._8_4_ * local_28e0._8_4_;
                  auVar110._12_4_ = auVar37._12_4_ * local_28e0._12_4_;
                  auVar110._16_4_ = local_28e0._16_4_ * 0.0;
                  auVar110._20_4_ = local_28e0._20_4_ * 0.0;
                  auVar110._24_4_ = local_28e0._24_4_ * 0.0;
                  auVar110._28_4_ = 0;
                  auVar13 = vfmadd231ps_fma(auVar110,ZEXT1632(auVar36),_local_28c0);
                  auVar68._8_4_ = 0x80000000;
                  auVar68._0_8_ = 0x8000000080000000;
                  auVar68._12_4_ = 0x80000000;
                  auVar68._16_4_ = 0x80000000;
                  auVar68._20_4_ = 0x80000000;
                  auVar68._24_4_ = 0x80000000;
                  auVar68._28_4_ = 0x80000000;
                  auVar152 = vandps_avx(ZEXT1632(auVar106),auVar68);
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar35),_local_28a0);
                  uVar116 = auVar152._0_4_;
                  auVar139._0_4_ = (float)(uVar116 ^ auVar13._0_4_);
                  uVar128 = auVar152._4_4_;
                  auVar139._4_4_ = (float)(uVar128 ^ auVar13._4_4_);
                  uVar129 = auVar152._8_4_;
                  auVar139._8_4_ = (float)(uVar129 ^ auVar13._8_4_);
                  uVar130 = auVar152._12_4_;
                  auVar139._12_4_ = (float)(uVar130 ^ auVar13._12_4_);
                  auVar124._16_4_ = auVar152._16_4_;
                  auVar139._16_4_ = auVar124._16_4_;
                  auVar124._20_4_ = auVar152._20_4_;
                  auVar139._20_4_ = auVar124._20_4_;
                  auVar124._24_4_ = auVar152._24_4_;
                  auVar139._24_4_ = auVar124._24_4_;
                  auVar124._28_4_ = auVar152._28_4_;
                  auVar139._28_4_ = auVar124._28_4_;
                  auVar152 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,5);
                  auVar25 = auVar107 & auVar152;
                  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar25 >> 0x7f,0) != '\0') ||
                        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0xbf,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar25[0x1f] < '\0') {
                    auVar152 = vandps_avx(auVar107,auVar152);
                    auVar13 = vpackssdw_avx(auVar152._0_16_,auVar152._16_16_);
                    auVar58._4_4_ = auVar37._4_4_ * auVar151._4_4_;
                    auVar58._0_4_ = auVar37._0_4_ * auVar151._0_4_;
                    auVar58._8_4_ = auVar37._8_4_ * auVar151._8_4_;
                    auVar58._12_4_ = auVar37._12_4_ * auVar151._12_4_;
                    auVar58._16_4_ = auVar151._16_4_ * 0.0;
                    auVar58._20_4_ = auVar151._20_4_ * 0.0;
                    auVar58._24_4_ = auVar151._24_4_ * 0.0;
                    auVar58._28_4_ = auVar169._28_4_;
                    auVar36 = vfmadd132ps_fma(auVar121,auVar58,ZEXT1632(auVar36));
                    auVar35 = vfmadd213ps_fma(auVar136,ZEXT1632(auVar35),ZEXT1632(auVar36));
                    auVar133._0_4_ = (float)(uVar116 ^ auVar35._0_4_);
                    auVar133._4_4_ = (float)(uVar128 ^ auVar35._4_4_);
                    auVar133._8_4_ = (float)(uVar129 ^ auVar35._8_4_);
                    auVar133._12_4_ = (float)(uVar130 ^ auVar35._12_4_);
                    auVar133._16_4_ = auVar124._16_4_;
                    auVar133._20_4_ = auVar124._20_4_;
                    auVar133._24_4_ = auVar124._24_4_;
                    auVar133._28_4_ = auVar124._28_4_;
                    auVar152 = vcmpps_avx(auVar133,ZEXT832(0) << 0x20,5);
                    auVar35 = vpackssdw_avx(auVar152._0_16_,auVar152._16_16_);
                    auVar13 = vpand_avx(auVar13,auVar35);
                    auVar152 = vpmovsxwd_avx2(auVar13);
                    if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar152 >> 0x7f,0) != '\0') ||
                          (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar152 >> 0xbf,0) != '\0') ||
                        (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar152[0x1f] < '\0') {
                      auVar152 = vandps_avx(ZEXT1632(auVar106),local_2800);
                      auVar136 = vsubps_avx(auVar152,auVar139);
                      auVar136 = vcmpps_avx(auVar136,auVar133,5);
                      auVar35 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
                      auVar13 = vpand_avx(auVar13,auVar35);
                      auVar136 = vpmovsxwd_avx2(auVar13);
                      if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar136 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar136 >> 0x7f,0) != '\0') ||
                            (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar136 >> 0xbf,0) != '\0') ||
                          (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar136[0x1f] < '\0') {
                        uStack_2a44 = auVar21._28_4_;
                        auVar59._4_4_ = auVar21._4_4_ * auVar34._4_4_;
                        auVar59._0_4_ = auVar21._0_4_ * auVar34._0_4_;
                        auVar59._8_4_ = auVar21._8_4_ * auVar34._8_4_;
                        auVar59._12_4_ = auVar21._12_4_ * auVar34._12_4_;
                        auVar59._16_4_ = auVar21._16_4_ * 0.0;
                        auVar59._20_4_ = auVar21._20_4_ * 0.0;
                        auVar59._24_4_ = auVar21._24_4_ * 0.0;
                        auVar59._28_4_ = uStack_2a44;
                        auVar35 = vfmadd132ps_fma(auVar108,auVar59,auVar158);
                        auVar35 = vfmadd213ps_fma(auVar169,auVar156,ZEXT1632(auVar35));
                        auVar124._0_4_ = (float)(uVar116 ^ auVar35._0_4_);
                        auVar124._4_4_ = (float)(uVar128 ^ auVar35._4_4_);
                        auVar124._8_4_ = (float)(uVar129 ^ auVar35._8_4_);
                        auVar124._12_4_ = (float)(uVar130 ^ auVar35._12_4_);
                        local_2a20._0_4_ = auVar152._0_4_;
                        local_2a20._4_4_ = auVar152._4_4_;
                        fStack_2a18 = auVar152._8_4_;
                        fStack_2a14 = auVar152._12_4_;
                        fStack_2a10 = auVar152._16_4_;
                        fStack_2a0c = auVar152._20_4_;
                        fStack_2a08 = auVar152._24_4_;
                        uStack_2a04 = auVar152._28_4_;
                        auVar134._0_4_ = (float)local_2a20._0_4_ * (float)local_27a0;
                        auVar134._4_4_ = (float)local_2a20._4_4_ * local_27a0._4_4_;
                        auVar134._8_4_ = fStack_2a18 * (float)uStack_2798;
                        auVar134._12_4_ = fStack_2a14 * uStack_2798._4_4_;
                        auVar134._16_4_ = fStack_2a10 * (float)uStack_2790;
                        auVar134._20_4_ = fStack_2a0c * uStack_2790._4_4_;
                        auVar134._24_4_ = fStack_2a08 * (float)uStack_2788;
                        auVar134._28_4_ = 0;
                        auVar60._4_4_ = (float)local_2a20._4_4_ * *(float *)(ray + 0x104);
                        auVar60._0_4_ = (float)local_2a20._0_4_ * *(float *)pRVar6;
                        auVar60._8_4_ = fStack_2a18 * *(float *)(ray + 0x108);
                        auVar60._12_4_ = fStack_2a14 * *(float *)(ray + 0x10c);
                        auVar60._16_4_ = fStack_2a10 * *(float *)(ray + 0x110);
                        auVar60._20_4_ = fStack_2a0c * *(float *)(ray + 0x114);
                        auVar60._24_4_ = fStack_2a08 * *(float *)(ray + 0x118);
                        auVar60._28_4_ = uStack_2a04;
                        auVar136 = vcmpps_avx(auVar134,auVar124,1);
                        auVar121 = vcmpps_avx(auVar124,auVar60,2);
                        auVar136 = vandps_avx(auVar136,auVar121);
                        auVar35 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
                        auVar13 = vpand_avx(auVar35,auVar13);
                        auVar136 = vpmovsxwd_avx2(auVar13);
                        if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar136 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar136 >> 0x7f,0) != '\0')
                              || (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar136 >> 0xbf,0) != '\0') ||
                            (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar136[0x1f] < '\0') {
                          auVar136 = vcmpps_avx(ZEXT1632(auVar106),ZEXT832(0) << 0x20,4);
                          auVar106 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
                          auVar106 = vpand_avx(auVar13,auVar106);
                          auVar136 = vpmovsxwd_avx2(auVar106);
                          if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar136 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar136 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar136 >> 0x7f,0) != '\0') ||
                                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar136 >> 0xbf,0) != '\0') ||
                              (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar136[0x1f] < '\0') {
                            uVar128 = *(uint *)(lVar99 + lVar95 * 4);
                            uVar116 = ((context->scene->geometries).items[uVar128].ptr)->mask;
                            auVar135._4_4_ = uVar116;
                            auVar135._0_4_ = uVar116;
                            auVar135._8_4_ = uVar116;
                            auVar135._12_4_ = uVar116;
                            auVar135._16_4_ = uVar116;
                            auVar135._20_4_ = uVar116;
                            auVar135._24_4_ = uVar116;
                            auVar135._28_4_ = uVar116;
                            auVar136 = vpand_avx2(auVar135,local_27c0);
                            auVar136 = vpcmpeqd_avx2(ZEXT832(0) << 0x20,auVar136);
                            auVar13 = vpackssdw_avx(SUB3216(auVar136 ^ _DAT_01fe9960,0),
                                                    SUB3216(auVar136 ^ _DAT_01fe9960,0x10));
                            auVar106 = vpand_avx(auVar13,auVar106);
                            auVar136 = vpmovsxwd_avx2(auVar106);
                            if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar136 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar136 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar136 >> 0x7f,0) != '\0') ||
                                  (auVar136 & (undefined1  [32])0x100000000) !=
                                  (undefined1  [32])0x0) || SUB321(auVar136 >> 0xbf,0) != '\0') ||
                                (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar136[0x1f] < '\0') {
                              auVar121 = vrcpps_avx(auVar152);
                              auVar144._8_4_ = 0x3f800000;
                              auVar144._0_8_ = 0x3f8000003f800000;
                              auVar144._12_4_ = 0x3f800000;
                              auVar144._16_4_ = 0x3f800000;
                              auVar144._20_4_ = 0x3f800000;
                              auVar144._24_4_ = 0x3f800000;
                              auVar144._28_4_ = 0x3f800000;
                              auVar106 = vfnmadd213ps_fma(auVar152,auVar121,auVar144);
                              auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar121,auVar121);
                              fVar162 = auVar106._0_4_;
                              fVar165 = auVar106._4_4_;
                              auVar61._4_4_ = fVar165 * auVar133._4_4_;
                              auVar61._0_4_ = fVar162 * auVar133._0_4_;
                              fVar161 = auVar106._8_4_;
                              auVar61._8_4_ = fVar161 * auVar133._8_4_;
                              fVar168 = auVar106._12_4_;
                              auVar61._12_4_ = fVar168 * auVar133._12_4_;
                              auVar61._16_4_ = auVar124._16_4_ * 0.0;
                              auVar61._20_4_ = auVar124._20_4_ * 0.0;
                              auVar61._24_4_ = auVar124._24_4_ * 0.0;
                              auVar61._28_4_ = auVar121._28_4_;
                              auVar152 = vminps_avx(auVar61,auVar144);
                              auVar151 = vsubps_avx(auVar144,auVar152);
                              auVar69._8_8_ = uVar89;
                              auVar69._0_8_ = uVar88;
                              auVar69._16_8_ = uVar88;
                              auVar69._24_8_ = uVar89;
                              auVar121 = vblendvps_avx(auVar152,auVar151,auVar69);
                              auVar62._4_4_ = fVar165 * auVar139._4_4_;
                              auVar62._0_4_ = fVar162 * auVar139._0_4_;
                              auVar62._8_4_ = fVar161 * auVar139._8_4_;
                              auVar62._12_4_ = fVar168 * auVar139._12_4_;
                              auVar62._16_4_ = auVar124._16_4_ * 0.0;
                              auVar62._20_4_ = auVar124._20_4_ * 0.0;
                              auVar62._24_4_ = auVar124._24_4_ * 0.0;
                              auVar62._28_4_ = auVar151._28_4_;
                              auVar152 = vminps_avx(auVar62,auVar144);
                              auVar151 = vsubps_avx(auVar144,auVar152);
                              auVar151 = vblendvps_avx(auVar152,auVar151,auVar69);
                              auVar63._4_4_ = fVar165 * auVar124._4_4_;
                              auVar63._0_4_ = fVar162 * auVar124._0_4_;
                              auVar63._8_4_ = fVar161 * auVar124._8_4_;
                              auVar63._12_4_ = fVar168 * auVar124._12_4_;
                              auVar63._16_4_ = auVar124._16_4_ * 0.0;
                              auVar63._20_4_ = auVar124._20_4_ * 0.0;
                              auVar63._24_4_ = auVar124._24_4_ * 0.0;
                              auVar63._28_4_ = auVar124._28_4_;
                              uVar91 = *(undefined4 *)(local_2960 + lVar95 * 4);
                              auVar145._4_4_ = uVar91;
                              auVar145._0_4_ = uVar91;
                              auVar145._8_4_ = uVar91;
                              auVar145._12_4_ = uVar91;
                              auVar145._16_4_ = uVar91;
                              auVar145._20_4_ = uVar91;
                              auVar145._24_4_ = uVar91;
                              auVar145._28_4_ = uVar91;
                              auVar152 = vmaskmovps_avx(auVar136,auVar63);
                              *(undefined1 (*) [32])pRVar6 = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,auVar156);
                              *(undefined1 (*) [32])(ray + 0x180) = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,auVar158);
                              *(undefined1 (*) [32])(ray + 0x1a0) = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,ZEXT1632(auVar34));
                              *(undefined1 (*) [32])(ray + 0x1c0) = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,auVar151);
                              *(undefined1 (*) [32])(ray + 0x1e0) = auVar152;
                              auVar152 = vmaskmovps_avx(auVar136,auVar121);
                              *(undefined1 (*) [32])(ray + 0x200) = auVar152;
                              auVar152 = vpmaskmovd_avx2(auVar136,auVar145);
                              *(undefined1 (*) [32])(ray + 0x220) = auVar152;
                              auVar125._4_4_ = uVar128;
                              auVar125._0_4_ = uVar128;
                              auVar125._8_4_ = uVar128;
                              auVar125._12_4_ = uVar128;
                              auVar125._16_4_ = uVar128;
                              auVar125._20_4_ = uVar128;
                              auVar125._24_4_ = uVar128;
                              auVar125._28_4_ = uVar128;
                              auVar152 = vpmaskmovd_avx2(auVar136,auVar125);
                              *(undefined1 (*) [32])(ray + 0x240) = auVar152;
                              uVar116 = context->user->instID[0];
                              auVar126._4_4_ = uVar116;
                              auVar126._0_4_ = uVar116;
                              auVar126._8_4_ = uVar116;
                              auVar126._12_4_ = uVar116;
                              auVar126._16_4_ = uVar116;
                              auVar126._20_4_ = uVar116;
                              auVar126._24_4_ = uVar116;
                              auVar126._28_4_ = uVar116;
                              auVar152 = vpmaskmovd_avx2(auVar136,auVar126);
                              *(undefined1 (*) [32])(ray + 0x260) = auVar152;
                              uVar116 = context->user->instPrimID[0];
                              auVar127._4_4_ = uVar116;
                              auVar127._0_4_ = uVar116;
                              auVar127._8_4_ = uVar116;
                              auVar127._12_4_ = uVar116;
                              auVar127._16_4_ = uVar116;
                              auVar127._20_4_ = uVar116;
                              auVar127._24_4_ = uVar116;
                              auVar127._28_4_ = uVar116;
                              auVar152 = vpmaskmovd_avx2(auVar136,auVar127);
                              *(undefined1 (*) [32])(ray + 0x280) = auVar152;
                            }
                          }
                        }
                      }
                    }
                  }
                  lVar95 = lVar95 + 1;
                } while (lVar95 != 4);
                lVar96 = lVar96 + 1;
                lVar99 = lVar99 + 0xe0;
              } while (lVar96 != uVar92 - 8);
            }
            auVar159 = ZEXT3264(local_25c0);
            auVar152 = vcmpps_avx(*(undefined1 (*) [32])pRVar6,local_25c0,1);
            auVar152 = auVar107 & auVar152;
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar152 >> 0x7f,0) != '\0') ||
                  (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar152 >> 0xbf,0) != '\0') ||
                (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar152[0x1f] < '\0') {
              auVar107 = vblendvps_avx(local_25c0,*(undefined1 (*) [32])pRVar6,auVar107);
              auVar159 = ZEXT3264(auVar107);
              auVar152 = vshufps_avx(auVar107,auVar107,0xb1);
              auVar107 = vmaxps_avx(auVar107,auVar152);
              auVar152 = vshufpd_avx(auVar107,auVar107,5);
              auVar107 = vmaxps_avx(auVar107,auVar152);
              local_2b40 = vmaxss_avx(auVar107._0_16_,auVar107._16_16_);
            }
          }
        }
        local_2ae0._4_4_ = local_2b40._0_4_;
        local_2ae0._0_4_ = local_2ae0._4_4_;
        fStack_2ad8 = (float)local_2ae0._4_4_;
        fStack_2ad4 = (float)local_2ae0._4_4_;
        fStack_2ad0 = (float)local_2ae0._4_4_;
        fStack_2acc = (float)local_2ae0._4_4_;
        fStack_2ac8 = (float)local_2ae0._4_4_;
        fStack_2ac4 = (float)local_2ae0._4_4_;
LAB_00635200:
      } while (puVar100 != &local_23a0);
    } while (uVar97 != 0);
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }